

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

Option * __thiscall
kj::MainBuilder::Impl::addOption
          (Impl *this,initializer_list<kj::MainBuilder::OptionName> names,bool hasArg,
          StringPtr helpText)

{
  Exception *__s;
  anon_union_8_2_b8f7b3a3_for_OptionName_1 aVar1;
  undefined7 uVar2;
  Option *pOVar3;
  OptionName *pOVar4;
  size_t sVar5;
  anon_union_8_2_b8f7b3a3_for_OptionName_1 *params_1;
  size_t amount;
  ulong uVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>,_bool> pVar8;
  Fault f;
  
  sVar5 = names._M_len;
  if (sVar5 == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x12e,FAILED,"names.size() > 0","\"option must have at least one name\"",
               (char (*) [35])"option must have at least one name");
    _::Debug::Fault::fatal(&f);
  }
  uVar6 = 0;
  pOVar3 = (Option *)Arena::allocateBytes(&this->arena,0x40,8,false);
  (pOVar3->argTitle).content.ptr = (char *)0x0;
  (pOVar3->argTitle).content.size_ = 0;
  (pOVar3->helpText).content.ptr = (char *)0x0;
  (pOVar3->helpText).content.size_ = 0;
  (pOVar3->names).ptr = (OptionName *)0x0;
  (pOVar3->names).size_ = 0;
  *(undefined8 *)&pOVar3->hasArg = 0;
  (pOVar3->field_2).func = (Function<kj::MainBuilder::Validity_()> *)0x0;
  (pOVar3->argTitle).content.ptr = "";
  (pOVar3->argTitle).content.size_ = 1;
  (pOVar3->helpText).content.ptr = "";
  (pOVar3->helpText).content.size_ = 1;
  amount = sVar5 << 4;
  pOVar4 = (OptionName *)Arena::allocateBytes(&this->arena,amount,8,false);
  (pOVar3->names).ptr = pOVar4;
  (pOVar3->names).size_ = sVar5;
  params_1 = &(names._M_array)->field_1;
  do {
    uVar2 = *(undefined7 *)&((OptionName *)(params_1 + -1))->field_0x1;
    aVar1.longName = *(char **)params_1;
    pOVar4 = (pOVar3->names).ptr + uVar6;
    pOVar4->isLong = ((OptionName *)(params_1 + -1))->isLong;
    *(undefined7 *)&pOVar4->field_0x1 = uVar2;
    (pOVar4->field_1).longName = (char *)aVar1;
    if (((OptionName *)(params_1 + -1))->isLong == true) {
      __s = (Exception *)params_1->longName;
      strlen((char *)__s);
      f.exception = __s;
      pVar7 = std::
              _Rb_tree<kj::ArrayPtr<char_const>,std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>,kj::MainBuilder::Impl::CharArrayCompare,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
              ::
              _M_emplace_unique<std::pair<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*>>
                        ((_Rb_tree<kj::ArrayPtr<char_const>,std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>,kj::MainBuilder::Impl::CharArrayCompare,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
                          *)&this->longOptions,
                         (pair<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*> *)&f);
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17],char_const*const&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
                   ,0x138,FAILED,
                   "longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second"
                   ,"\"duplicate option\", name.longName",(char (*) [17])"duplicate option",
                   &params_1->longName);
        _::Debug::Fault::fatal(&f);
      }
    }
    else {
      f.exception._0_1_ = params_1->shortName;
      pVar8 = std::
              _Rb_tree<char,std::pair<char_const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<char_const,kj::MainBuilder::Impl::Option*>>,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
              ::_M_emplace_unique<std::pair<char,kj::MainBuilder::Impl::Option*>>
                        ((_Rb_tree<char,std::pair<char_const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<char_const,kj::MainBuilder::Impl::Option*>>,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
                          *)&this->shortOptions,(pair<char,_kj::MainBuilder::Impl::Option_*> *)&f);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17],char_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
                   ,0x13c,FAILED,
                   "shortOptions.insert(std::make_pair(name.shortName, &option)).second",
                   "\"duplicate option\", name.shortName",(char (*) [17])"duplicate option",
                   &params_1->shortName);
        _::Debug::Fault::fatal(&f);
      }
    }
    params_1 = params_1 + 2;
    uVar6 = (ulong)((int)uVar6 + 1);
    amount = amount - 0x10;
  } while (amount != 0);
  pOVar3->hasArg = hasArg;
  (pOVar3->helpText).content.ptr = helpText.content.ptr;
  (pOVar3->helpText).content.size_ = helpText.content.size_;
  return pOVar3;
}

Assistant:

Option& addOption(std::initializer_list<OptionName> names, bool hasArg, StringPtr helpText) {
    KJ_REQUIRE(names.size() > 0, "option must have at least one name");

    Option& option = arena.allocate<Option>();
    option.names = arena.allocateArray<OptionName>(names.size());
    uint i = 0;
    for (auto& name: names) {
      option.names[i++] = name;
      if (name.isLong) {
        KJ_REQUIRE(
            longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second,
            "duplicate option", name.longName);
      } else {
        KJ_REQUIRE(
            shortOptions.insert(std::make_pair(name.shortName, &option)).second,
            "duplicate option", name.shortName);
      }
    }
    option.hasArg = hasArg;
    option.helpText = helpText;
    return option;
  }